

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_buffer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  parseArgs(argc,argv);
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30002);
  glfwWindowHint(0x22002,2);
  window = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    iVar1 = gladLoadGLES2Loader(glfwGetProcAddress);
    if (iVar1 == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      if (mapMethod == MAP_BUFFER_OES) {
        testMapBufferOES();
      }
      else if (mapMethod == MAP_BUFFER_RANGE_EXT) {
        testMapBufferRangeEXT();
      }
      else if (mapMethod == MAP_BUFFER_RANGE_3_0) {
        testMapBufferRange30();
      }
      glfwDestroyWindow(window);
      glfwTerminate();
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    parseArgs(argc, argv);

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

   if (!gladLoadGLES2Loader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
   }

    switch (mapMethod) {
    case MAP_BUFFER_OES:
        testMapBufferOES();
        break;
    case MAP_BUFFER_RANGE_EXT:
        testMapBufferRangeEXT();
        break;
    case MAP_BUFFER_RANGE_3_0:
        testMapBufferRange30();
        break;
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}